

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Question * __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
          (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint *id)

{
  uint *puVar1;
  Question *pQVar2;
  Question *pQVar3;
  RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *pRVar4;
  Question *pQVar5;
  uint uVar6;
  size_t newSize;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  puVar1 = (this->freeIds).c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar1 == (this->freeIds).c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    pQVar5 = (this->slots).builder.ptr;
    pQVar2 = (this->slots).builder.pos;
    uVar6 = (int)((ulong)((long)pQVar2 - (long)pQVar5) >> 3) * -0x33333333;
    *id = uVar6;
    _kjCondition.value = (int)uVar6 >= 0;
    if ((int)uVar6 < 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xfb,FAILED,"!isHigh(id)","_kjCondition,\"2^31 concurrent questions?!!?!\"",
                 &_kjCondition,(char (*) [31])"2^31 concurrent questions?!!?!");
      kj::_::Debug::Fault::fatal(&f);
    }
    pQVar3 = (this->slots).builder.endPtr;
    if (pQVar2 == pQVar3) {
      newSize = 4;
      if (pQVar3 != pQVar5) {
        newSize = ((long)pQVar3 - (long)pQVar5 >> 3) * -0x6666666666666666;
      }
      kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::setCapacity
                (&this->slots,newSize);
    }
    pRVar4 = (this->slots).builder.pos;
    (pRVar4->paramExports).disposer = (ArrayDisposer *)0x0;
    (pRVar4->selfRef).ptr = (QuestionRef *)0x0;
    (pRVar4->paramExports).ptr = (uint *)0x0;
    (pRVar4->paramExports).size_ = 0;
    pRVar4->isAwaitingReturn = false;
    pRVar4->isTailCall = false;
    pRVar4->skipFinish = false;
    *(undefined5 *)&pRVar4->field_0x23 = 0;
    pQVar5 = (this->slots).builder.pos;
    (this->slots).builder.pos = pQVar5 + 1;
  }
  else {
    *id = *puVar1;
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::pop(&this->freeIds);
    pQVar5 = (this->slots).builder.ptr + *id;
  }
  return pQVar5;
}

Assistant:

T& next(Id& id) {
    if (freeIds.empty()) {
      id = slots.size();
      KJ_ASSERT(!isHigh(id), "2^31 concurrent questions?!!?!");
      return slots.add();
    } else {
      id = freeIds.top();
      freeIds.pop();
      return slots[id];
    }
  }